

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool anon_unknown.dwarf_7f56f::cmCTestAddSubdirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  string local_d8;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  long local_88;
  undefined1 *local_80;
  size_type local_78;
  pointer local_70;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  undefined8 local_48;
  undefined1 *local_40;
  undefined1 local_38 [32];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_98._M_len = (size_t)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((long *)local_98._M_len != &local_88) {
      operator_delete((void *)local_98._M_len,local_88 + 1);
    }
    bVar3 = false;
  }
  else {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    local_80 = local_38;
    local_48 = 1;
    local_38[0] = 0x2f;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_98._M_len = local_60;
    local_98._M_str = (char *)local_68;
    local_88 = 1;
    local_70 = (pbVar2->_M_dataplus)._M_p;
    local_78 = pbVar2->_M_string_length;
    views._M_len = 3;
    views._M_array = &local_98;
    local_40 = local_80;
    cmCatViews_abi_cxx11_(&local_d8,views);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    paVar1 = &local_d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar1) {
      local_b8.field_2._8_8_ = local_d8.field_2._8_8_;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    }
    local_b8.field_2._M_allocated_capacity._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
    local_b8.field_2._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
    local_b8._M_string_length = local_d8._M_string_length;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = ReadSubdirectory(&local_b8,status);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool cmCTestAddSubdirectoryCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string fname =
    cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), '/', args[0]);

  return ReadSubdirectory(std::move(fname), status);
}